

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O2

void __thiscall
soul::Structure::updateMemberType(Structure *this,string_view memberName,Type *newType)

{
  size_t index;
  Member *this_00;
  
  index = getMemberIndex(this,memberName);
  this_00 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[](&this->members,index);
  Type::operator=(&this_00->type,newType);
  return;
}

Assistant:

void Structure::updateMemberType (std::string_view memberName, const Type& newType)
{
    auto index = getMemberIndex (memberName);
    members[index].type = newType;
}